

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_gen.c
# Opt level: O1

param_3 * parse_param_3(char *type)

{
  param_3 *ppVar1;
  char *pcVar2;
  double dVar3;
  
  ppVar1 = (param_3 *)malloc(0x18);
  if (ppVar1 != (param_3 *)0x0) {
    strtok(type,":");
    pcVar2 = strtok((char *)0x0,":");
    dVar3 = atof(pcVar2);
    ppVar1->a = dVar3;
    pcVar2 = strtok((char *)0x0,":");
    dVar3 = atof(pcVar2);
    ppVar1->b = dVar3;
    pcVar2 = strtok((char *)0x0,":");
    dVar3 = atof(pcVar2);
    ppVar1->c = dVar3;
    return ppVar1;
  }
  __assert_fail("params",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/rand_gen.c"
                ,0x140,"struct param_3 *parse_param_3(char *)");
}

Assistant:

static struct param_3 *parse_param_3(char *type)
{
	char *tok;
	struct param_3 *params;

	params = (struct param_3 *)malloc(sizeof(struct param_3));
	assert(params);

	tok = strtok(type, ":");
	tok = strtok(NULL, ":");
	params->a = atof(tok);
	tok = strtok(NULL, ":");
	params->b = atof(tok);
	tok = strtok(NULL, ":");
	params->c = atof(tok);

	return params;
}